

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O2

void __thiscall
ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::reallocate
          (ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *this,size_t size)

{
  Expression **ppEVar1;
  ulong uVar2;
  size_t i;
  ulong uVar3;
  
  ppEVar1 = this->data;
  ArenaVector<wasm::Expression_*>::allocate((ArenaVector<wasm::Expression_*> *)this,size);
  uVar2 = this->usedElements;
  for (uVar3 = 0; uVar3 < uVar2; uVar3 = uVar3 + 1) {
    this->data[uVar3] = ppEVar1[uVar3];
  }
  return;
}

Assistant:

void reallocate(size_t size) {
    T* old = data;
    static_cast<SubType*>(this)->allocate(size);
    for (size_t i = 0; i < usedElements; i++) {
      data[i] = old[i];
    }
  }